

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_operators.hpp
# Opt level: O3

rt_expression_interface<double> * __thiscall
viennamath::
op_unary<viennamath::op_rt_integral<viennamath::rt_expression_interface<double>_>,_viennamath::rt_expression_interface<double>_>
::diff(op_unary<viennamath::op_rt_integral<viennamath::rt_expression_interface<double>_>,_viennamath::rt_expression_interface<double>_>
       *this,rt_expression_interface<double> *e,rt_expression_interface<double> *diff_var)

{
  rt_expression_interface<double> *prVar1;
  op_rt_integral<viennamath::rt_expression_interface<double>_> local_40;
  
  rt_interval<viennamath::rt_expression_interface<double>_>::rt_interval
            (&local_40.interval_,&(this->unary_op_).interval_);
  local_40.integration_variable_.super_rt_expression_interface<double>._vptr_rt_expression_interface
       = (_func_int **)&PTR__rt_expression_interface_00125e60;
  local_40.integration_variable_.id_ = (this->unary_op_).integration_variable_.id_;
  prVar1 = diff_impl<viennamath::rt_expression_interface<double>>(e,&local_40,diff_var);
  if (local_40.interval_.upper_.rt_expr_._M_ptr != (rt_expression_interface<double> *)0x0) {
    (*(*(_func_int ***)local_40.interval_.upper_.rt_expr_._M_ptr)[1])();
  }
  if (local_40.interval_.lower_.rt_expr_._M_ptr != (rt_expression_interface<double> *)0x0) {
    (*(*(_func_int ***)local_40.interval_.lower_.rt_expr_._M_ptr)[1])();
  }
  return prVar1;
}

Assistant:

InterfaceType * diff(const InterfaceType * e,
                           const InterfaceType * diff_var) const
      {
        return diff_impl(e, unary_op_, diff_var);
      }